

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
zmq::object_t::send_pipe_peer_stats
          (object_t *this,pipe_t *destination_,uint64_t queue_count_,own_t *socket_base_,
          endpoint_uri_pair_t *endpoint_pair_)

{
  command_t *in_RSI;
  command_t cmd;
  undefined4 in_stack_ffffffffffffff4c;
  
  send_command((object_t *)CONCAT44(in_stack_ffffffffffffff4c,0x13),in_RSI);
  return;
}

Assistant:

void zmq::object_t::send_pipe_peer_stats (pipe_t *destination_,
                                          uint64_t queue_count_,
                                          own_t *socket_base_,
                                          endpoint_uri_pair_t *endpoint_pair_)
{
    command_t cmd;
    cmd.destination = destination_;
    cmd.type = command_t::pipe_peer_stats;
    cmd.args.pipe_peer_stats.queue_count = queue_count_;
    cmd.args.pipe_peer_stats.socket_base = socket_base_;
    cmd.args.pipe_peer_stats.endpoint_pair = endpoint_pair_;
    send_command (cmd);
}